

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void __thiscall gvr::PointCloud::addExtend(PointCloud *this,Vector3d *emin,Vector3d *emax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar22;
  undefined4 uVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar24;
  float fVar25;
  float fVar26;
  float fVar28;
  float fVar29;
  undefined4 uVar30;
  undefined1 auVar27 [16];
  undefined4 uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  
  uVar8 = (ulong)(uint)(this->n * 3);
  pfVar4 = this->vertex;
  bVar17 = true;
  fVar32 = 3.4028235e+38;
  fVar33 = -3.4028235e+38;
  fVar35 = 3.4028235e+38;
  fVar36 = -3.4028235e+38;
  fVar37 = 3.4028235e+38;
  fVar38 = -3.4028235e+38;
  while (bVar17) {
    fVar19 = 3.4028235e+38;
    fVar22 = 3.4028235e+38;
    uVar23 = 0;
    uVar24 = 0;
    fVar25 = -3.4028235e+38;
    fVar28 = -3.4028235e+38;
    uVar30 = 0;
    uVar31 = 0;
    uVar12 = uVar8;
    fVar34 = 3.4028235e+38;
    fVar39 = -3.4028235e+38;
    while( true ) {
      uVar12 = uVar12 - 3;
      if ((int)(uint)uVar12 < 0) break;
      uVar14 = (ulong)((uint)uVar12 & 0x7fffffff);
      uVar9 = *(ulong *)(pfVar4 + uVar14);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar9;
      if (((((fVar33 <= (float)uVar9) && ((float)uVar9 < fVar32)) &&
           (fVar26 = (float)(uVar9 >> 0x20), fVar36 <= fVar26)) &&
          ((fVar26 < fVar35 && (fVar26 = pfVar4[uVar14 + 2], fVar38 <= fVar26)))) &&
         (fVar26 < fVar37)) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar9;
        auVar6._4_4_ = fVar22;
        auVar6._0_4_ = fVar19;
        auVar6._8_4_ = uVar23;
        auVar6._12_4_ = uVar24;
        auVar21 = minps(auVar20,auVar6);
        fVar29 = fVar26;
        if (fVar34 <= fVar26) {
          fVar29 = fVar34;
        }
        auVar7._4_4_ = fVar28;
        auVar7._0_4_ = fVar25;
        auVar7._8_4_ = uVar30;
        auVar7._12_4_ = uVar31;
        auVar27 = maxps(auVar27,auVar7);
        if (fVar26 <= fVar39) {
          fVar26 = fVar39;
        }
        fVar19 = auVar21._0_4_;
        fVar22 = auVar21._4_4_;
        uVar23 = auVar21._8_4_;
        uVar24 = auVar21._12_4_;
        fVar25 = auVar27._0_4_;
        fVar28 = auVar27._4_4_;
        uVar30 = auVar27._8_4_;
        uVar31 = auVar27._12_4_;
        fVar34 = fVar29;
        fVar39 = fVar26;
      }
    }
    if (((fVar25 < fVar19) || (fVar28 < fVar22)) || (fVar39 < fVar34)) break;
    fVar26 = (fVar25 + fVar19) * 0.5;
    fVar29 = (fVar28 + fVar22) * 0.5;
    fVar40 = (fVar39 + fVar34) * 0.5;
    iVar10 = 0;
    iVar15 = 0;
    iVar13 = 0;
    uVar11 = 0;
    uVar12 = uVar8;
    while( true ) {
      uVar9 = uVar12;
      uVar12 = uVar9 - 3;
      if ((int)(uint)uVar12 < 0) break;
      fVar1 = pfVar4[(uint)uVar12 & 0x7fffffff];
      if ((((fVar33 <= fVar1) && (fVar1 < fVar32)) &&
          ((fVar2 = pfVar4[uVar9 - 2], fVar36 <= fVar2 &&
           ((fVar2 < fVar35 && (fVar3 = pfVar4[uVar9 - 1], fVar38 <= fVar3)))))) && (fVar3 < fVar37)
         ) {
        auVar21._4_4_ = -(uint)(fVar1 < fVar26);
        auVar21._0_4_ = -(uint)(fVar1 < fVar26);
        auVar21._8_4_ = -(uint)(fVar2 < fVar29);
        auVar21._12_4_ = -(uint)(fVar2 < fVar29);
        uVar16 = movmskpd((int)uVar9,auVar21);
        iVar10 = iVar10 + (uVar16 & 1);
        iVar15 = iVar15 + (uVar16 >> 1 & 0x7f);
        iVar13 = iVar13 + (uint)(fVar3 < fVar40);
        uVar11 = uVar11 + 1;
      }
    }
    bVar17 = false;
    fVar32 = fVar25;
    fVar33 = fVar19;
    fVar35 = fVar28;
    fVar36 = fVar22;
    fVar37 = fVar39;
    fVar38 = fVar34;
    if (this->n < (int)(uVar11 * 2)) {
      if (fVar25 <= fVar19) {
        bVar17 = false;
      }
      else {
        bVar17 = (uint)(iVar10 * 100) < uVar11;
        fVar33 = fVar26;
        if (!bVar17) {
          fVar33 = fVar19;
        }
        if ((int)((uVar11 - iVar10) * 100) < (int)uVar11) {
          bVar17 = true;
          fVar25 = fVar26;
        }
      }
      if (fVar22 < fVar28) {
        bVar18 = (uint)(iVar15 * 100) < uVar11;
        fVar32 = fVar29;
        if (!bVar18) {
          fVar32 = fVar22;
        }
        fVar22 = fVar32;
        if ((int)((uVar11 - iVar15) * 100) < (int)uVar11) {
          bVar17 = true;
          fVar28 = fVar29;
        }
        else {
          bVar17 = (bool)(bVar18 | bVar17);
        }
      }
      fVar32 = fVar25;
      fVar35 = fVar28;
      fVar36 = fVar22;
      if (fVar34 < fVar39) {
        bVar18 = (uint)(iVar13 * 100) < uVar11;
        fVar38 = fVar40;
        if (!bVar18) {
          fVar38 = fVar34;
        }
        bVar17 = (bool)(bVar17 | bVar18);
        if ((int)((uVar11 - iVar13) * 100) < (int)uVar11) {
          bVar17 = true;
          fVar37 = fVar40;
        }
      }
    }
  }
  dVar5 = (double)fVar33 + (this->super_Model).origin.v[0];
  if (emin->v[0] <= dVar5) {
    dVar5 = emin->v[0];
  }
  emin->v[0] = dVar5;
  dVar5 = (double)fVar36 + (this->super_Model).origin.v[1];
  if (emin->v[1] <= dVar5) {
    dVar5 = emin->v[1];
  }
  emin->v[1] = dVar5;
  dVar5 = (double)fVar38 + (this->super_Model).origin.v[2];
  if (emin->v[2] <= dVar5) {
    dVar5 = emin->v[2];
  }
  emin->v[2] = dVar5;
  dVar5 = (double)fVar32 + (this->super_Model).origin.v[0];
  if (dVar5 <= emax->v[0]) {
    dVar5 = emax->v[0];
  }
  emax->v[0] = dVar5;
  dVar5 = (double)fVar35 + (this->super_Model).origin.v[1];
  if (dVar5 <= emax->v[1]) {
    dVar5 = emax->v[1];
  }
  emax->v[1] = dVar5;
  dVar5 = (double)fVar37 + (this->super_Model).origin.v[2];
  if (dVar5 <= emax->v[2]) {
    dVar5 = emax->v[2];
  }
  emax->v[2] = dVar5;
  return;
}

Assistant:

void PointCloud::addExtend(gmath::Vector3d &emin, gmath::Vector3d &emax) const
{
  float pxmin=-std::numeric_limits<float>::max();
  float pymin=-std::numeric_limits<float>::max();
  float pzmin=-std::numeric_limits<float>::max();
  float pxmax=std::numeric_limits<float>::max();
  float pymax=std::numeric_limits<float>::max();
  float pzmax=std::numeric_limits<float>::max();

  bool repeat=true;
  while (repeat)
  {
    repeat=false;

    // compute extend

    float xmin=std::numeric_limits<float>::max();
    float ymin=std::numeric_limits<float>::max();
    float zmin=std::numeric_limits<float>::max();
    float xmax=-std::numeric_limits<float>::max();
    float ymax=-std::numeric_limits<float>::max();
    float zmax=-std::numeric_limits<float>::max();

    for (int i=3*(n-1); i>=0; i-=3)
    {
      float x=vertex[i];
      float y=vertex[i+1];
      float z=vertex[i+2];

      if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
      {
        xmin=std::min(xmin, x);
        ymin=std::min(ymin, y);
        zmin=std::min(zmin, z);

        xmax=std::max(xmax, x);
        ymax=std::max(ymax, y);
        zmax=std::max(zmax, z);
      }
    }

    if (xmax >= xmin && ymax >= ymin && zmax >= zmin)
    {
      // divide range of each coordinate into two halves compute number of points
      // in each halve

      int nxmin=0;
      int nymin=0;
      int nzmin=0;
      int m=0;

      float xmean=(xmax+xmin)/2;
      float ymean=(ymax+ymin)/2;
      float zmean=(zmax+zmin)/2;

      for (int i=3*(n-1); i>=0; i-=3)
      {
        float x=vertex[i];
        float y=vertex[i+1];
        float z=vertex[i+2];

        if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
        {
          if (vertex[i] < xmean)
          {
            nxmin++;
          }

          if (vertex[i+1] < ymean)
          {
            nymin++;
          }

          if (vertex[i+2] < zmean)
          {
            nzmin++;
          }

          m++;
        }
      }

      pxmin=xmin;
      pxmax=xmax;
      pymin=ymin;
      pymax=ymax;
      pzmin=zmin;
      pzmax=zmax;

      if (2*m > n)
      {
        // reduce range and try again if one half contains less than 1/100 of the
        // points

        if (pxmax > pxmin)
        {
          if (nxmin*100 < m)
          {
            pxmin=xmean;
            repeat=true;
          }

          if ((m-nxmin)*100 < m)
          {
            pxmax=xmean;
            repeat=true;
          }
        }

        if (pymax > pymin)
        {
          if (nymin*100 < m)
          {
            pymin=ymean;
            repeat=true;
          }

          if ((m-nymin)*100 < m)
          {
            pymax=ymean;
            repeat=true;
          }
        }

        if (pzmax > pzmin)
        {
          if (nzmin*100 < m)
          {
            pzmin=zmean;
            repeat=true;
          }

          if ((m-nzmin)*100 < m)
          {
            pzmax=zmean;
            repeat=true;
          }
        }
      }
    }
  }

  // add extend

  emin[0]=std::min(emin[0], getOrigin()[0]+pxmin);
  emin[1]=std::min(emin[1], getOrigin()[1]+pymin);
  emin[2]=std::min(emin[2], getOrigin()[2]+pzmin);

  emax[0]=std::max(emax[0], getOrigin()[0]+pxmax);
  emax[1]=std::max(emax[1], getOrigin()[1]+pymax);
  emax[2]=std::max(emax[2], getOrigin()[2]+pzmax);
}